

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PNGImageHandler.cpp
# Opt level: O0

PNGImageInfo * __thiscall
PNGImageHandler::ReadImageInfo
          (PNGImageInfo *__return_storage_ptr__,PNGImageHandler *this,
          IByteReaderWithPosition *inPNGStream)

{
  png_byte pVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  png_uint_32 pVar5;
  png_uint_32 pVar6;
  __jmp_buf_tag *__env;
  bool bVar7;
  uint local_54;
  png_byte colorComponents;
  bool isAlpha;
  png_byte channels_count;
  png_byte transformed_color_type;
  png_uint_32 transformed_height;
  png_uint_32 transformed_width;
  png_byte bit_depth;
  png_byte color_type;
  png_infop info_ptr;
  png_structp png_ptr;
  IByteReaderWithPosition *pIStack_18;
  EStatusCode status;
  IByteReaderWithPosition *inPNGStream_local;
  PNGImageHandler *this_local;
  
  png_ptr._4_4_ = 0;
  info_ptr = (png_infop)0x0;
  _transformed_width = (png_const_inforp)0x0;
  pIStack_18 = inPNGStream;
  inPNGStream_local = (IByteReaderWithPosition *)this;
  PNGImageInfo::PNGImageInfo(__return_storage_ptr__);
  info_ptr = (png_infop)
             png_create_read_struct("1.6.32",(png_voidp)0x0,HandlePngError,HandlePngWarning);
  if ((png_structp)info_ptr != (png_structp)0x0) {
    __env = (__jmp_buf_tag *)png_set_longjmp_fn((png_structrp)info_ptr,longjmp,200);
    iVar4 = _setjmp(__env);
    if (iVar4 == 0) {
      png_set_read_fn((png_structrp)info_ptr,pIStack_18,ReadDataFromStream);
      _transformed_width = png_create_info_struct((png_const_structrp)info_ptr);
      if (_transformed_width == (png_infop)0x0) {
        png_error((png_const_structrp)info_ptr,"OOM allocating info structure");
      }
      png_set_keep_unknown_chunks((png_structrp)info_ptr,3,(png_const_bytep)0x0,0);
      png_read_info((png_structrp)info_ptr,_transformed_width);
      pVar1 = png_get_color_type((png_const_structrp)info_ptr,_transformed_width);
      bVar2 = png_get_bit_depth((png_const_structrp)info_ptr,_transformed_width);
      if (pVar1 == '\x03') {
        png_set_palette_to_rgb((png_structrp)info_ptr);
      }
      if ((pVar1 == '\0') && (bVar2 < 8)) {
        png_set_expand_gray_1_2_4_to_8((png_structrp)info_ptr);
      }
      pVar5 = png_get_valid((png_const_structrp)info_ptr,_transformed_width,0x10);
      if (pVar5 != 0) {
        png_set_tRNS_to_alpha((png_structrp)info_ptr);
      }
      if (bVar2 == 0x10) {
        png_set_strip_16((png_structrp)info_ptr);
      }
      if (bVar2 < 8) {
        png_set_packing((png_structrp)info_ptr);
      }
      png_read_update_info((png_structrp)info_ptr,_transformed_width);
      pVar5 = png_get_image_width((png_const_structrp)info_ptr,_transformed_width);
      pVar6 = png_get_image_height((png_const_structrp)info_ptr,_transformed_width);
      bVar2 = png_get_color_type((png_const_structrp)info_ptr,_transformed_width);
      bVar3 = png_get_channels((png_const_structrp)info_ptr,_transformed_width);
      bVar7 = (bVar2 & 4) != 0;
      if (bVar7) {
        local_54 = bVar3 - 1;
      }
      else {
        local_54 = (uint)bVar3;
      }
      __return_storage_ptr__->colorComponents = local_54 & 0xff;
      __return_storage_ptr__->hasAlpha = bVar7;
      (__return_storage_ptr__->dimensions).first = (double)pVar5;
      (__return_storage_ptr__->dimensions).second = (double)pVar6;
    }
    else {
      png_ptr._4_4_ = 0xffffffff;
    }
  }
  png_destroy_read_struct((png_structpp)&info_ptr,(png_infopp)&transformed_width,(png_infopp)0x0);
  return __return_storage_ptr__;
}

Assistant:

PNGImageHandler::PNGImageInfo PNGImageHandler::ReadImageInfo(IByteReaderWithPosition* inPNGStream) {
	// reading as is set by internal reader (meaning, post transformations)

	EStatusCode status = eSuccess;
	png_structp png_ptr = NULL;
	png_infop info_ptr = NULL;
	PNGImageHandler::PNGImageInfo data;

	do {
		// init structs and prep 
		png_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, HandlePngError, HandlePngWarning);
		if (png_ptr == NULL) {
			break;
		}

		if (setjmp(png_jmpbuf(png_ptr)))
		{
			status = eFailure;
			break;
		}

		// pair png with custom IO (dont bother with writing)
		png_set_read_fn(png_ptr, (png_voidp)inPNGStream, ReadDataFromStream);

		// create info struct
		info_ptr = png_create_info_struct(png_ptr);
		if (info_ptr == NULL) {
			png_error(png_ptr, "OOM allocating info structure");
		}

		// Gal: is this important?
		png_set_keep_unknown_chunks(png_ptr, PNG_HANDLE_CHUNK_ALWAYS, NULL, 0);

		// read info from png
		png_read_info(png_ptr, info_ptr);

		png_byte color_type = png_get_color_type(png_ptr, info_ptr);
		png_byte bit_depth = png_get_bit_depth(png_ptr, info_ptr);

		// Let's setup some default transformations, and then reprint the png info that will
		// now adapt to post-translation

		// all them set_expand option, to bring us to a common 8 bits per component as a minimum
		if (color_type == PNG_COLOR_TYPE_PALETTE)
			png_set_palette_to_rgb(png_ptr);
		if (color_type == PNG_COLOR_TYPE_GRAY &&
			bit_depth < 8) png_set_expand_gray_1_2_4_to_8(png_ptr);
		if (png_get_valid(png_ptr, info_ptr,
			PNG_INFO_tRNS)) png_set_tRNS_to_alpha(png_ptr);

		// now let's also avoid 16 bits for now, to stay always at 8 bits per component
		if (bit_depth == 16)
			png_set_strip_16(png_ptr);

		// and let's deal with random < 8 packing, so we're surely in 8 bits now
		if (bit_depth < 8)
			png_set_packing(png_ptr);

		// let's update info so now it fits the post transform data
		png_read_update_info(png_ptr, info_ptr);

		// grab updated info
		png_uint_32 transformed_width = png_get_image_width(png_ptr, info_ptr);
		png_uint_32 transformed_height = png_get_image_height(png_ptr, info_ptr);
		png_byte transformed_color_type = png_get_color_type(png_ptr, info_ptr);
		png_byte channels_count = png_get_channels(png_ptr, info_ptr);
		bool isAlpha = (transformed_color_type & PNG_COLOR_MASK_ALPHA) != 0;
		png_byte colorComponents = isAlpha ? (channels_count - 1) : channels_count;


		data.colorComponents = colorComponents;
		data.hasAlpha = isAlpha;
		data.dimensions.first = transformed_width;
		data.dimensions.second = transformed_height;

	} while (false);

	png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
	return data;
}